

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::SpecifyConditionVisitor::visit<slang::ast::ClockingEventExpression>
          (SpecifyConditionVisitor *this,ClockingEventExpression *expr)

{
  ExpressionKind EVar1;
  BinaryOperator BVar2;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  string_view arg;
  bool bVar3;
  Symbol *this_00;
  Type *pTVar4;
  UnaryExpression *pUVar5;
  BinaryExpression *pBVar6;
  ConversionExpression *this_01;
  Expression *in_RSI;
  Diagnostic *in_RDI;
  Diagnostic *diag;
  Symbol *sym;
  undefined4 in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff68;
  SpecifyConditionVisitor *in_stack_ffffffffffffff70;
  DiagCode noteCode;
  SourceLocation in_stack_ffffffffffffff78;
  SourceLocation in_stack_ffffffffffffff80;
  SourceLocation in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode code;
  Diagnostic *in_stack_ffffffffffffffa0;
  Expression *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  code = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  bVar3 = Expression::bad((Expression *)in_RDI);
  if ((!bVar3) && (EVar1 = in_RSI->kind, 1 < EVar1 - IntegerLiteral)) {
    if (EVar1 == NamedValue) {
      this_00 = Expression::getSymbolReference
                          (in_stack_ffffffffffffffa8,
                           SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
      noteCode = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
      if (((this_00 != (Symbol *)0x0) && (this_00->kind != Specparam)) &&
         (((this_00->kind != Net && (this_00->kind != Variable)) ||
          (pTVar4 = (Type *)Symbol::getParentScope(this_00),
          pTVar4 != (((Expression *)&in_RDI->args)->type).ptr)))) {
        sourceRange_02.endLoc = in_stack_ffffffffffffff88;
        sourceRange_02.startLoc = in_stack_ffffffffffffff80;
        ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff78,code,sourceRange_02);
        arg._M_str._0_4_ = in_stack_ffffffffffffffb0;
        arg._M_len = (size_t)in_stack_ffffffffffffffa8;
        arg._M_str._4_4_ = in_stack_ffffffffffffffb4;
        Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg);
        Diagnostic::addNote(in_RDI,noteCode,in_stack_ffffffffffffff68);
      }
    }
    else if ((((EVar1 - UnaryOp < 3) || (EVar1 - Concatenation < 2)) || (EVar1 - ElementSelect < 2))
            || ((EVar1 - Call < 2 || (EVar1 == MinTypMax)))) {
      ClockingEventExpression::visitExprs<slang::ast::SpecifyConditionVisitor&>
                ((ClockingEventExpression *)in_RDI,
                 (SpecifyConditionVisitor *)CONCAT44(EVar1,in_stack_ffffffffffffff58));
      if (in_RSI->kind == UnaryOp) {
        pUVar5 = Expression::as<slang::ast::UnaryExpression>(in_RSI);
        if (7 < pUVar5->op - BitwiseNot) {
          sourceRange.endLoc = in_stack_ffffffffffffff80;
          sourceRange.startLoc = in_stack_ffffffffffffff78;
          reportError(in_stack_ffffffffffffff70,sourceRange);
        }
      }
      else if (in_RSI->kind == BinaryOp) {
        pBVar6 = Expression::as<slang::ast::BinaryExpression>(in_RSI);
        BVar2 = pBVar6->op;
        if ((5 < BVar2 - BinaryAnd) && (BVar2 != LogicalAnd && BVar2 != LogicalOr)) {
          sourceRange_00.endLoc = in_stack_ffffffffffffff80;
          sourceRange_00.startLoc = in_stack_ffffffffffffff78;
          reportError(in_stack_ffffffffffffff70,sourceRange_00);
        }
      }
      else if (in_RSI->kind == Conversion) {
        this_01 = Expression::as<slang::ast::ConversionExpression>(in_RSI);
        bVar3 = ConversionExpression::isImplicit(this_01);
        if (!bVar3) {
          reportError(in_stack_ffffffffffffff70,in_RSI->sourceRange);
        }
      }
    }
    else {
      sourceRange_01.endLoc = in_stack_ffffffffffffff80;
      sourceRange_01.startLoc = in_stack_ffffffffffffff78;
      reportError((SpecifyConditionVisitor *)(in_RSI->sourceRange).endLoc,sourceRange_01);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.bad())
                return;

            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        // Specparams are always allowed.
                        if (sym->kind == SymbolKind::Specparam)
                            break;

                        // Other references must be locally defined nets or variables.
                        if ((sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) ||
                            sym->getParentScope() != specifyParentScope) {
                            auto& diag = context.addDiag(diag::SpecifyPathBadReference,
                                                         expr.sourceRange);
                            diag << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect:
                case ExpressionKind::Call:
                case ExpressionKind::MinTypMax:
                case ExpressionKind::Concatenation:
                case ExpressionKind::Replication:
                case ExpressionKind::ConditionalOp:
                case ExpressionKind::UnaryOp:
                case ExpressionKind::BinaryOp:
                case ExpressionKind::Conversion:
                    if constexpr (HasVisitExprs<T, SpecifyConditionVisitor>)
                        expr.visitExprs(*this);

                    if (expr.kind == ExpressionKind::UnaryOp) {
                        switch (expr.template as<UnaryExpression>().op) {
                            case UnaryOperator::BitwiseNot:
                            case UnaryOperator::BitwiseAnd:
                            case UnaryOperator::BitwiseOr:
                            case UnaryOperator::BitwiseXor:
                            case UnaryOperator::BitwiseNand:
                            case UnaryOperator::BitwiseNor:
                            case UnaryOperator::BitwiseXnor:
                            case UnaryOperator::LogicalNot:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::BinaryOp) {
                        switch (expr.template as<BinaryExpression>().op) {
                            case BinaryOperator::BinaryAnd:
                            case BinaryOperator::BinaryOr:
                            case BinaryOperator::BinaryXor:
                            case BinaryOperator::BinaryXnor:
                            case BinaryOperator::Equality:
                            case BinaryOperator::Inequality:
                            case BinaryOperator::LogicalAnd:
                            case BinaryOperator::LogicalOr:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::Conversion) {
                        if (!expr.template as<ConversionExpression>().isImplicit())
                            reportError(expr.sourceRange);
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                case ExpressionKind::RealLiteral:
                    break;
                default:
                    reportError(expr.sourceRange);
                    break;
            }
        }
    }